

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
ManySubcommands_Required2Exact_Test::TestBody(ManySubcommands_Required2Exact_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  AssertHelper local_b0;
  Message local_a8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9e;
  undefined1 local_9d;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  iterator local_60;
  size_type local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ManySubcommands_Required2Exact_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  CLI::App::require_subcommand(&(this->super_ManySubcommands).super_TApp.app,2);
  TApp::run((TApp *)this);
  CLI::App::remaining_abi_cxx11_(&local_38,(this->super_ManySubcommands).sub2,false);
  local_9d = 1;
  local_88 = &local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"sub3",&local_89);
  local_9d = 0;
  local_60 = &local_80;
  local_58 = 1;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_9e);
  __l._M_len = local_58;
  __l._M_array = local_60;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,__l,&local_9e);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_20,"sub2->remaining()","vs_t({\"sub3\"})",&local_38,&local_50)
  ;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_9e);
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
  do {
    local_d8 = local_d8 + -1;
    std::__cxx11::string::~string((string *)local_d8);
  } while (local_d8 != &local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x2a7,message);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST_F(ManySubcommands, Required2Exact) {
    app.require_subcommand(2);

    run();
    EXPECT_EQ(sub2->remaining(), vs_t({"sub3"}));
}